

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::TSPI_PDU::SetSystemSpecificData(TSPI_PDU *this,vector<char,_std::allocator<char>_> *SSD)

{
  KUINT16 *pKVar1;
  pointer pcVar2;
  pointer pcVar3;
  KUINT16 KVar4;
  long lVar5;
  
  pcVar2 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  KVar4 = ((short)pcVar2 - (short)pcVar3) +
          (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
  (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = KVar4;
  if (pcVar2 != pcVar3) {
    (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag & 0x40) == 0) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag | 0x40;
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = KVar4 + 1;
  }
  std::vector<char,_std::allocator<char>_>::operator=(&this->m_vSSD,SSD);
  lVar5 = (long)(this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  this->m_ui8SSDLen = (KUINT8)lVar5;
  pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (short)lVar5;
  return;
}

Assistant:

void TSPI_PDU::SetSystemSpecificData( const std::vector<KOCTET> & SSD )
{
    ClearSystemSpecificData();
    SetSystemSpecificDataFlag( true );
    m_vSSD = SSD;
    m_ui8SSDLen = m_vSSD.size();

    // Set the new pdu length
    m_ui16PDULength += m_vSSD.size();
}